

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::setData(QTreeWidgetItem *this,int column,int role,QVariant *value)

{
  QList<QList<QWidgetItemData>_> *this_00;
  int *piVar1;
  uint uVar2;
  QTreeWidgetItem *pQVar3;
  QList<QWidgetItemData> *pQVar4;
  ulong uVar5;
  undefined8 uVar6;
  char cVar7;
  bool bVar8;
  QTreeModel *this_01;
  long lVar9;
  pointer pQVar10;
  pointer pQVar11;
  pointer pQVar12;
  long lVar13;
  int i;
  ulong uVar14;
  QVariantList *this_02;
  int iVar15;
  long lVar16;
  long in_FS_OFFSET;
  initializer_list<int> args;
  size_type sStack_a0;
  undefined1 local_78 [8];
  QVariant QStack_70;
  QArrayDataPointer<QWidgetItemData> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (column < 0) goto LAB_00550344;
  uVar5 = (ulong)(uint)column;
  this_01 = treeModel(this,(QTreeWidget *)0x0);
  if (role == 0) {
LAB_0054ffa5:
    if ((ulong)(this->values).d.size <= uVar5) {
      if ((this_01 == (QTreeModel *)0x0) || (this_01->headerItem != this)) {
        QList<QList<QWidgetItemData>_>::resize(&this->values,(ulong)(column + 1));
      }
      else {
        QTreeModel::setColumnCount(this_01,column + 1);
      }
    }
    uVar14 = (this->d->display).d.size;
    if (uVar5 < uVar14) {
      pQVar12 = QList<QVariant>::data(&this->d->display);
      bVar8 = ::operator!=(pQVar12 + uVar5,value);
      if (!bVar8) goto LAB_00550344;
      pQVar12 = QList<QVariant>::data(&this->d->display);
      ::QVariant::operator=(pQVar12 + uVar5,value);
    }
    else {
      for (iVar15 = (int)uVar14 + -1; this_02 = &this->d->display, iVar15 < column + -1;
          iVar15 = iVar15 + 1) {
        local_78 = (undefined1  [8])0x0;
        QStack_70.d.data._0_8_ = (undefined1 *)0x0;
        QStack_70.d.data._8_8_ = (undefined1 *)0x0;
        QStack_70.d.data._16_8_ = 2;
        QList<QVariant>::emplaceBack<QVariant>(this_02,(QVariant *)local_78);
        ::QVariant::~QVariant((QVariant *)local_78);
      }
      QList<QVariant>::emplaceBack<QVariant_const&>(this_02,value);
    }
  }
  else {
    if (role == 10) {
      if (((this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
           super_QFlagsStorage<Qt::ItemFlag>.i & 0x40) != 0) {
        ::QVariant::QVariant((QVariant *)local_78,1);
        bVar8 = ::operator!=(value,(QVariant *)local_78);
        ::QVariant::~QVariant((QVariant *)local_78);
        if (bVar8) {
          for (uVar14 = 0; uVar14 < (ulong)(this->children).d.size; uVar14 = uVar14 + 1) {
            pQVar3 = (this->children).d.ptr[uVar14];
            (*pQVar3->_vptr_QTreeWidgetItem[3])((QVariant *)local_78,pQVar3,uVar5,10);
            uVar6 = QStack_70.d.data._16_8_;
            ::QVariant::~QVariant((QVariant *)local_78);
            if (3 < (ulong)uVar6) {
              uVar2 = (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                      super_QFlagsStorage<Qt::ItemFlag>.i;
              (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i = uVar2 & 0xffffffbf;
              (*pQVar3->_vptr_QTreeWidgetItem[4])(pQVar3,uVar5,10,value);
              (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i = uVar2;
            }
          }
        }
      }
    }
    else if (role == 2) goto LAB_0054ffa5;
    this_00 = &this->values;
    if (uVar5 < (ulong)(this->values).d.size) {
      pQVar4 = (this->values).d.ptr;
      local_50.d = pQVar4[uVar5].d.d;
      local_50.ptr = pQVar4[uVar5].d.ptr;
      local_50.size = pQVar4[uVar5].d.size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar9 = local_50.size + 1;
      lVar16 = 0x20;
      lVar13 = 0;
      do {
        lVar9 = lVar9 + -1;
        if (lVar9 == 0) {
          pQVar10 = QList<QList<QWidgetItemData>_>::data(this_00);
          local_78._0_4_ = role;
          ::QVariant::QVariant(&QStack_70,value);
          QList<QWidgetItemData>::emplaceBack<QWidgetItemData>
                    (pQVar10 + uVar5,(QWidgetItemData *)local_78);
          ::QVariant::~QVariant(&QStack_70);
          goto LAB_00550189;
        }
        lVar16 = lVar16 + -0x28;
        piVar1 = (int *)((long)&(local_50.ptr)->role + lVar13);
        lVar13 = lVar13 + 0x28;
      } while (*piVar1 != role);
      cVar7 = ::QVariant::equals((QVariant *)((long)local_50.ptr - lVar16));
      if (cVar7 != '\0') {
        QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_50);
        goto LAB_00550344;
      }
      pQVar10 = QList<QList<QWidgetItemData>_>::data(this_00);
      pQVar11 = QList<QWidgetItemData>::data(pQVar10 + uVar5);
      ::QVariant::operator=((QVariant *)((long)pQVar11 - lVar16),value);
LAB_00550189:
      QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_50);
    }
    else {
      if ((this_01 == (QTreeModel *)0x0) || (this_01->headerItem != this)) {
        QList<QList<QWidgetItemData>_>::resize(this_00,(ulong)(column + 1));
      }
      else {
        QTreeModel::setColumnCount(this_01,column + 1);
      }
      pQVar10 = QList<QList<QWidgetItemData>_>::data(this_00);
      local_78._0_4_ = role;
      ::QVariant::QVariant(&QStack_70,value);
      QList<QWidgetItemData>::emplaceBack<QWidgetItemData>
                (pQVar10 + uVar5,(QWidgetItemData *)local_78);
      ::QVariant::~QVariant(&QStack_70);
    }
  }
  if (this_01 != (QTreeModel *)0x0) {
    QStack_70.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QStack_70.d.data._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if ((role & 0xfffffffdU) == 0) {
      local_50.d = (Data *)0x200000000;
      sStack_a0 = 2;
    }
    else {
      local_50.d = (Data *)CONCAT44(local_50.d._4_4_,role);
      sStack_a0 = 1;
    }
    args._M_array = &local_50;
    args._M_len = sStack_a0;
    QList<int>::QList((QList<int> *)local_78,args);
    QTreeModel::emitDataChanged(this_01,this,column,(QList<int> *)local_78);
    if (role == 10) {
      while ((this = this->par, this != (QTreeWidgetItem *)0x0 &&
             (((this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
               super_QFlagsStorage<Qt::ItemFlag>.i & 0x40) != 0))) {
        QTreeModel::emitDataChanged(this_01,this,column,(QList<int> *)local_78);
      }
    }
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_78);
  }
LAB_00550344:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setData(int column, int role, const QVariant &value)
{
    if (column < 0)
        return;

    QTreeModel *model = treeModel();
    switch (role) {
    case Qt::EditRole:
    case Qt::DisplayRole: {
        if (values.size() <= column) {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
        }
        if (d->display.size() <= column) {
            for (int i = d->display.size() - 1; i < column - 1; ++i)
                d->display.append(QVariant());
            d->display.append(value);
        } else if (d->display[column] != value) {
            d->display[column] = value;
        } else {
            return; // value is unchanged
        }
    } break;
    case Qt::CheckStateRole:
        if ((itemFlags & Qt::ItemIsAutoTristate) && value != Qt::PartiallyChecked) {
            for (int i = 0; i < children.size(); ++i) {
                QTreeWidgetItem *child = children.at(i);
                if (child->data(column, role).isValid()) {// has a CheckState
                    Qt::ItemFlags f = itemFlags; // a little hack to avoid multiple dataChanged signals
                    itemFlags &= ~Qt::ItemIsAutoTristate;
                    child->setData(column, role, value);
                    itemFlags = f;
                }
            }
        }
        Q_FALLTHROUGH();
    default:
        if (column < values.size()) {
            bool found = false;
            const QList<QWidgetItemData> column_values = values.at(column);
            for (int i = 0; i < column_values.size(); ++i) {
                if (column_values.at(i).role == role) {
                    if (column_values.at(i).value == value)
                        return; // value is unchanged
                    values[column][i].value = value;
                    found = true;
                    break;
                }
            }
            if (!found)
                values[column].append(QWidgetItemData(role, value));
        } else {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
            values[column].append(QWidgetItemData(role, value));
        }
    }

    if (model) {
        const QList<int> roles((role == Qt::DisplayRole || role == Qt::EditRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->emitDataChanged(this, column, roles);
        if (role == Qt::CheckStateRole) {
            QTreeWidgetItem *p;
            for (p = par; p && (p->itemFlags & Qt::ItemIsAutoTristate); p = p->par)
                model->emitDataChanged(p, column, roles);
        }
    }
}